

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_CommandLineArguments_shuffleBeforeDoesNotDisturbOtherSwitch_TestShell::createTest
          (TEST_CommandLineArguments_shuffleBeforeDoesNotDisturbOtherSwitch_TestShell *this)

{
  TEST_CommandLineArguments_shuffleBeforeDoesNotDisturbOtherSwitch_Test *this_00;
  
  this_00 = (TEST_CommandLineArguments_shuffleBeforeDoesNotDisturbOtherSwitch_Test *)
            operator_new(0x18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                         ,0xb0);
  TEST_CommandLineArguments_shuffleBeforeDoesNotDisturbOtherSwitch_Test::
  TEST_CommandLineArguments_shuffleBeforeDoesNotDisturbOtherSwitch_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(CommandLineArguments, shuffleBeforeDoesNotDisturbOtherSwitch)
{
    int argc = 4;
    const char* argv[] = { "tests.exe", "-s", "-sg", "group" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter groupFilter("group");
    groupFilter.strictMatching();
    CHECK_EQUAL(groupFilter, *args->getGroupFilters());
    CHECK_TRUE(args->isShuffling());
}